

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflex.h
# Opt level: O0

void __thiscall ClassInfo::~ClassInfo(ClassInfo *this)

{
  ClassInfo *this_local;
  
  ~ClassInfo(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ClassInfo(){}